

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> * __thiscall
pstore::dump::object::write_compact<std::ostream,pstore::dump::object_char_traits>
          (object *this,basic_ostream<char,_std::char_traits<char>_> *os,
          object_strings<pstore::dump::object_char_traits> *strings)

{
  bool bVar1;
  element_type *this_00;
  element_type *peVar2;
  object_strings<pstore::dump::object_char_traits> *__n;
  void *__buf;
  undefined1 local_58 [24];
  member *kvp;
  const_iterator __end2;
  const_iterator __begin2;
  container *__range2;
  string_type *separator;
  object_strings<pstore::dump::object_char_traits> *strings_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  object *this_local;
  
  std::operator<<(os,(string *)&strings->openbrace_str);
  __n = strings;
  __end2 = std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
           ::begin(&this->members_);
  kvp = (member *)
        std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::
        end(&this->members_);
  __range2 = (container *)strings;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_pstore::dump::object::member_*,_std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>_>
                                *)&kvp);
    if (!bVar1) break;
    local_58._16_8_ =
         __gnu_cxx::
         __normal_iterator<const_pstore::dump::object::member_*,_std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>_>
         ::operator*(&__end2);
    std::operator<<(os,(string *)__range2);
    property((object *)local_58,(string *)local_58._16_8_);
    this_00 = std::
              __shared_ptr_access<pstore::dump::string,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<pstore::dump::string,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_58);
    dump::value::write(&this_00->super_value,(int)os,__buf,(size_t)__n);
    std::shared_ptr<pstore::dump::string>::~shared_ptr((shared_ptr<pstore::dump::string> *)local_58)
    ;
    std::operator<<(os,(string *)&strings->colon_space_str);
    peVar2 = std::__shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(local_58._16_8_ + 0x20));
    (*peVar2->_vptr_value[0x13])(peVar2,os);
    __range2 = (container *)&strings->comma_space_str;
    __gnu_cxx::
    __normal_iterator<const_pstore::dump::object::member_*,_std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>_>
    ::operator++(&__end2);
  }
  std::operator<<(os,(string *)&strings->space_closebrace_str);
  return os;
}

Assistant:

OStream &
        object::write_compact (OStream & os,
                               object_strings<ObjectCharacterTraits> const & strings) const {
            os << strings.openbrace_str;
            auto const * separator = &strings.space_str;
            for (object::member const & kvp : members_) {
                os << *separator;
                object::property (kvp.property)->write (os);
                os << strings.colon_space_str;
                kvp.val->write (os);
                separator = &strings.comma_space_str;
            }
            os << strings.space_closebrace_str;
            return os;
        }